

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void * defaultAlloc(TidyAllocator *allocator,size_t size)

{
  void *local_28;
  void *p;
  size_t size_local;
  TidyAllocator *allocator_local;
  
  if (g_malloc == (TidyMalloc)0x0) {
    local_28 = malloc(size);
  }
  else {
    local_28 = (*g_malloc)(size);
  }
  if (local_28 == (void *)0x0) {
    defaultPanic(allocator,"Out of memory!");
  }
  return local_28;
}

Assistant:

static void* TIDY_CALL defaultAlloc( TidyAllocator* allocator, size_t size )
{
    void *p = ( g_malloc ? g_malloc(size) : malloc(size) );
    if ( !p )
        defaultPanic( allocator,"Out of memory!");
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_MEMORY)
    alloccnt++;
    SPRTF("%d: alloc   MEM %p, size %d\n", alloccnt, p, (int)size );
    if (size == 0) {
        SPRTF("NOTE: An allocation of ZERO bytes!!!!!!\n");
    }
#endif
    return p;
}